

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.h
# Opt level: O1

bool __thiscall Js::EntryPointInfo::IsNativeCode(EntryPointInfo *this)

{
  State SVar1;
  bool bVar2;
  
  SVar1 = GetState(this);
  bVar2 = true;
  if (SVar1 != CodeGenRecorded) {
    SVar1 = GetState(this);
    bVar2 = SVar1 == CodeGenDone;
  }
  return bVar2;
}

Assistant:

bool IsNativeCode() const
        {
#if ENABLE_NATIVE_CODEGEN
            return this->GetState() == CodeGenRecorded ||
                this->GetState() == CodeGenDone;
#else
            return false;
#endif
        }